

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.hh
# Opt level: O1

void tchecker::declare_flattened_variable<unsigned_int,tchecker::clock_info_t>
               (uint id,string *name,clock_info_t *info,
               function<void_(unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_tchecker::clock_info_t_&)>
               *declare)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  stringstream ss;
  clock_info_t local_1e8;
  uint local_1e4;
  ulong local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  uint local_1b8 [4];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar3 = (ulong)(info->super_size_info_t)._size;
  if (uVar3 == 1) {
    local_1b8[0] = id;
    if ((declare->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*declare->_M_invoker)((_Any_data *)declare,local_1b8,name,info);
  }
  else {
    local_1e8.super_size_info_t._size = (size_info_t)1;
    if (uVar3 != 0) {
      local_1e0 = (ulong)id;
      uVar2 = 0;
      do {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[",1);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
        std::__cxx11::stringbuf::str();
        local_1e4 = (int)local_1e0 + (int)uVar2;
        if ((declare->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*declare->_M_invoker)((_Any_data *)declare,&local_1e4,&local_1d8,&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
  }
  return;
}

Assistant:

void declare_flattened_variable(ID id, std::string const & name, INFO const & info,
                                std::function<void(ID, std::string const &, INFO const &)> declare)
{
  static_assert(std::is_base_of<tchecker::size_info_t, INFO>::value, "INFO should provide variable size");

  typename INFO::size_t size = info.size();

  if (size == 1)
    declare(id, name, info);
  else {
    INFO flat_info{info};
    flat_info.flatten();

    for (typename INFO::size_t i = 0; i < size; ++i) {
      std::stringstream ss;
      ss << name << "[" << i << "]";
      declare(id + i, ss.str(), flat_info);
    }
  }
}